

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O1

void pdqsort_detail::
     pdqsort_loop<__gnu_cxx::__normal_iterator<HighsGFkSolve::SolutionEntry*,std::vector<HighsGFkSolve::SolutionEntry,std::allocator<HighsGFkSolve::SolutionEntry>>>,std::less<HighsGFkSolve::SolutionEntry>,false>
               (__normal_iterator<HighsGFkSolve::SolutionEntry_*,_std::vector<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>_>
                begin,__normal_iterator<HighsGFkSolve::SolutionEntry_*,_std::vector<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>_>
                      end,int param_3,uint param_4)

{
  int *piVar1;
  undefined1 auVar2 [16];
  SolutionEntry SVar3;
  SolutionEntry SVar4;
  bool bVar5;
  int iVar6;
  undefined8 in_RAX;
  ulong uVar7;
  long lVar8;
  __normal_iterator<HighsGFkSolve::SolutionEntry_*,_std::vector<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>_>
  _Var9;
  SolutionEntry *pSVar10;
  SolutionEntry *pSVar11;
  SolutionEntry *pSVar12;
  SolutionEntry *pSVar13;
  ulong uVar14;
  __normal_iterator<HighsGFkSolve::SolutionEntry_*,_std::vector<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>_>
  _Var15;
  long lVar16;
  SolutionEntry *pSVar17;
  SolutionEntry *pSVar18;
  ulong uVar19;
  long lVar20;
  SolutionEntry *pSVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  _Iter_comp_iter<std::less<HighsGFkSolve::SolutionEntry>_> __cmp;
  _Iter_comp_iter<std::less<HighsGFkSolve::SolutionEntry>_> __cmp_1;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  do {
    uVar7 = (long)end._M_current - (long)begin._M_current >> 3;
    if ((long)uVar7 < 0x18) {
      pSVar10 = begin._M_current + 1;
      if ((param_4 & 1) == 0) {
        _Var9._M_current = begin._M_current;
        if (pSVar10 != end._M_current && begin._M_current != end._M_current) {
          do {
            if (_Var9._M_current[1].index < (_Var9._M_current)->index) {
              SVar3 = *pSVar10;
              pSVar13 = pSVar10;
              do {
                *pSVar13 = pSVar13[-1];
                pSVar17 = pSVar13 + -1;
                pSVar11 = pSVar13 + -2;
                pSVar13 = pSVar17;
              } while (SVar3.index < pSVar11->index);
              *pSVar17 = SVar3;
            }
            pSVar13 = pSVar10 + 1;
            _Var9._M_current = pSVar10;
            pSVar10 = pSVar13;
          } while (pSVar13 != end._M_current);
        }
      }
      else if (pSVar10 != end._M_current && begin._M_current != end._M_current) {
        lVar8 = 8;
        _Var9._M_current = begin._M_current;
        do {
          pSVar13 = pSVar10;
          if (_Var9._M_current[1].index < (_Var9._M_current)->index) {
            SVar3 = *pSVar13;
            lVar16 = lVar8;
            do {
              lVar20 = lVar16;
              *(undefined8 *)((long)&(begin._M_current)->index + lVar20) =
                   *(undefined8 *)((long)&begin._M_current[-1].index + lVar20);
              _Var9._M_current = begin._M_current;
              if (lVar20 == 8) goto LAB_002ce9d9;
              lVar16 = lVar20 + -8;
            } while (SVar3.index < *(int *)((long)&begin._M_current[-2].index + lVar20));
            _Var9._M_current = (SolutionEntry *)((long)&begin._M_current[-1].index + lVar20);
LAB_002ce9d9:
            *_Var9._M_current = SVar3;
          }
          lVar8 = lVar8 + 8;
          pSVar10 = pSVar13 + 1;
          _Var9._M_current = pSVar13;
        } while (pSVar13 + 1 != end._M_current);
      }
LAB_002cef54:
      bVar5 = true;
    }
    else {
      uVar14 = uVar7 >> 1;
      pSVar10 = begin._M_current + uVar14;
      if ((long)uVar7 < 0x81) {
        if ((begin._M_current)->index < pSVar10->index) {
          SVar3 = *pSVar10;
          *pSVar10 = *begin._M_current;
          *begin._M_current = SVar3;
        }
        if (end._M_current[-1].index < (begin._M_current)->index) {
          SVar3 = *begin._M_current;
          *begin._M_current = end._M_current[-1];
          end._M_current[-1] = SVar3;
        }
        _Var9._M_current = begin._M_current;
        _Var15._M_current = pSVar10;
        if ((begin._M_current)->index < pSVar10->index) goto LAB_002cebbc;
      }
      else {
        if (pSVar10->index < (begin._M_current)->index) {
          SVar3 = *begin._M_current;
          *begin._M_current = *pSVar10;
          *pSVar10 = SVar3;
        }
        if (end._M_current[-1].index < pSVar10->index) {
          SVar3 = *pSVar10;
          *pSVar10 = end._M_current[-1];
          end._M_current[-1] = SVar3;
        }
        if (pSVar10->index < (begin._M_current)->index) {
          SVar3 = *begin._M_current;
          *begin._M_current = *pSVar10;
          *pSVar10 = SVar3;
        }
        if (begin._M_current[uVar14 - 1].index < begin._M_current[1].index) {
          SVar3 = begin._M_current[1];
          begin._M_current[1] = begin._M_current[uVar14 - 1];
          begin._M_current[uVar14 - 1] = SVar3;
        }
        if (end._M_current[-2].index < begin._M_current[uVar14 - 1].index) {
          SVar3 = begin._M_current[uVar14 - 1];
          begin._M_current[uVar14 - 1] = end._M_current[-2];
          end._M_current[-2] = SVar3;
        }
        if (begin._M_current[uVar14 - 1].index < begin._M_current[1].index) {
          SVar3 = begin._M_current[1];
          begin._M_current[1] = begin._M_current[uVar14 - 1];
          begin._M_current[uVar14 - 1] = SVar3;
        }
        if (begin._M_current[uVar14 + 1].index < begin._M_current[2].index) {
          SVar3 = begin._M_current[2];
          begin._M_current[2] = begin._M_current[uVar14 + 1];
          begin._M_current[uVar14 + 1] = SVar3;
        }
        if (end._M_current[-3].index < begin._M_current[uVar14 + 1].index) {
          SVar3 = begin._M_current[uVar14 + 1];
          begin._M_current[uVar14 + 1] = end._M_current[-3];
          end._M_current[-3] = SVar3;
        }
        if (begin._M_current[uVar14 + 1].index < begin._M_current[2].index) {
          SVar3 = begin._M_current[2];
          begin._M_current[2] = begin._M_current[uVar14 + 1];
          begin._M_current[uVar14 + 1] = SVar3;
        }
        if (begin._M_current[uVar14].index < begin._M_current[uVar14 - 1].index) {
          auVar2 = *(undefined1 (*) [16])(begin._M_current + (uVar14 - 1));
          auVar22._0_8_ = auVar2._8_8_;
          auVar22._8_4_ = auVar2._0_4_;
          auVar22._12_4_ = auVar2._4_4_;
          *(undefined1 (*) [16])(begin._M_current + (uVar14 - 1)) = auVar22;
        }
        if (begin._M_current[uVar14 + 1].index < begin._M_current[uVar14].index) {
          auVar2 = *(undefined1 (*) [16])pSVar10;
          auVar23._0_8_ = auVar2._8_8_;
          auVar23._8_4_ = auVar2._0_4_;
          auVar23._12_4_ = auVar2._4_4_;
          *(undefined1 (*) [16])pSVar10 = auVar23;
        }
        _Var9._M_current = pSVar10;
        _Var15._M_current = begin._M_current;
        if (begin._M_current[uVar14].index < begin._M_current[uVar14 - 1].index) {
          auVar2 = *(undefined1 (*) [16])(begin._M_current + (uVar14 - 1));
          auVar24._0_8_ = auVar2._8_8_;
          auVar24._8_4_ = auVar2._0_4_;
          auVar24._12_4_ = auVar2._4_4_;
          *(undefined1 (*) [16])(begin._M_current + (uVar14 - 1)) = auVar24;
        }
LAB_002cebbc:
        SVar3 = *_Var15._M_current;
        *_Var15._M_current = *_Var9._M_current;
        *_Var9._M_current = SVar3;
      }
      if (((param_4 & 1) == 0) && ((begin._M_current)->index <= begin._M_current[-1].index)) {
        SVar3 = *begin._M_current;
        lVar8 = 0;
        do {
          lVar16 = lVar8;
          iVar6 = SVar3.index;
          lVar8 = lVar16 + -8;
        } while (iVar6 < *(int *)((long)&end._M_current[-1].index + lVar16));
        pSVar10 = (SolutionEntry *)((long)&end._M_current[-1].index + lVar16);
        _Var9._M_current = begin._M_current;
        if (lVar16 + -8 == -8) {
          do {
            pSVar13 = _Var9._M_current;
            if (pSVar10 <= _Var9._M_current) break;
            pSVar13 = _Var9._M_current + 1;
            pSVar17 = _Var9._M_current + 1;
            _Var9._M_current = pSVar13;
          } while (pSVar17->index <= iVar6);
        }
        else {
          do {
            pSVar13 = _Var9._M_current + 1;
            pSVar17 = _Var9._M_current + 1;
            _Var9._M_current = pSVar13;
          } while (pSVar17->index <= iVar6);
        }
        while (pSVar13 < pSVar10) {
          SVar4 = *pSVar13;
          *pSVar13 = *pSVar10;
          *pSVar10 = SVar4;
          pSVar17 = pSVar10;
          do {
            pSVar10 = pSVar17 + -1;
            pSVar11 = pSVar17 + -1;
            pSVar12 = pSVar13;
            pSVar17 = pSVar10;
          } while (iVar6 < pSVar11->index);
          do {
            pSVar17 = pSVar12 + 1;
            pSVar13 = pSVar12 + 1;
            pSVar12 = pSVar12 + 1;
          } while (pSVar17->index <= iVar6);
        }
        *begin._M_current = *pSVar10;
        *pSVar10 = SVar3;
        begin._M_current = pSVar10 + 1;
        bVar5 = false;
      }
      else {
        SVar3 = *begin._M_current;
        lVar16 = 0;
        lVar8 = 8;
        do {
          lVar16 = lVar16 + -8;
          piVar1 = (int *)((long)&(begin._M_current)->index + lVar8);
          iVar6 = SVar3.index;
          lVar8 = lVar8 + 8;
        } while (*piVar1 < iVar6);
        pSVar10 = begin._M_current - lVar16;
        _Var9._M_current = end._M_current;
        if (lVar16 == -8) {
          do {
            pSVar13 = _Var9._M_current;
            if (_Var9._M_current <= pSVar10) break;
            pSVar13 = _Var9._M_current + -1;
            pSVar17 = _Var9._M_current + -1;
            _Var9._M_current = pSVar13;
          } while (iVar6 <= pSVar17->index);
        }
        else {
          do {
            pSVar13 = _Var9._M_current + -1;
            pSVar17 = _Var9._M_current + -1;
            _Var9._M_current = pSVar13;
          } while (iVar6 <= pSVar17->index);
        }
        pSVar17 = pSVar10;
        pSVar11 = pSVar13;
        if (pSVar10 < pSVar13) {
          do {
            SVar4 = *pSVar17;
            *pSVar17 = *pSVar11;
            *pSVar11 = SVar4;
            do {
              pSVar12 = pSVar17;
              pSVar17 = pSVar12 + 1;
            } while (pSVar12[1].index < iVar6);
            do {
              pSVar18 = pSVar11 + -1;
              pSVar21 = pSVar11 + -1;
              pSVar11 = pSVar18;
            } while (iVar6 <= pSVar21->index);
          } while (pSVar17 < pSVar18);
        }
        else {
          pSVar12 = pSVar10 + -1;
        }
        *begin._M_current = *pSVar12;
        *pSVar12 = SVar3;
        uVar19 = (long)pSVar12 - (long)begin._M_current >> 3;
        pSVar17 = pSVar12 + 1;
        uVar14 = (long)end._M_current - (long)pSVar17 >> 3;
        if (((long)uVar19 < (long)(uVar7 >> 3)) || ((long)uVar14 < (long)(uVar7 >> 3))) {
          param_3 = param_3 + -1;
          if (param_3 == 0) {
            std::
            __make_heap<__gnu_cxx::__normal_iterator<HighsGFkSolve::SolutionEntry*,std::vector<HighsGFkSolve::SolutionEntry,std::allocator<HighsGFkSolve::SolutionEntry>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::less<HighsGFkSolve::SolutionEntry>>>
                      (begin,end,
                       (_Iter_comp_iter<std::less<HighsGFkSolve::SolutionEntry>_> *)
                       ((long)&uStack_38 + 2));
            std::
            __sort_heap<__gnu_cxx::__normal_iterator<HighsGFkSolve::SolutionEntry*,std::vector<HighsGFkSolve::SolutionEntry,std::allocator<HighsGFkSolve::SolutionEntry>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::less<HighsGFkSolve::SolutionEntry>>>
                      (begin,end,
                       (_Iter_comp_iter<std::less<HighsGFkSolve::SolutionEntry>_> *)
                       ((long)&uStack_38 + 3));
            param_3 = 0;
            goto LAB_002cef54;
          }
          if (0x17 < (long)uVar19) {
            uVar7 = uVar19 >> 2;
            SVar3 = *begin._M_current;
            *begin._M_current = begin._M_current[uVar7];
            begin._M_current[uVar7] = SVar3;
            SVar3 = pSVar12[-1];
            pSVar12[-1] = pSVar12[-uVar7];
            pSVar12[-uVar7] = SVar3;
            if (0x80 < (long)uVar19) {
              SVar3 = begin._M_current[1];
              begin._M_current[1] = begin._M_current[uVar7 + 1];
              begin._M_current[uVar7 + 1] = SVar3;
              SVar3 = begin._M_current[2];
              begin._M_current[2] = begin._M_current[uVar7 + 2];
              begin._M_current[uVar7 + 2] = SVar3;
              SVar3 = pSVar12[-2];
              pSVar12[-2] = pSVar12[~uVar7];
              pSVar12[~uVar7] = SVar3;
              SVar3 = pSVar12[-3];
              pSVar12[-3] = pSVar12[-2 - uVar7];
              pSVar12[-2 - uVar7] = SVar3;
            }
          }
          if (0x17 < (long)uVar14) {
            uVar7 = uVar14 >> 2;
            SVar3 = pSVar12[1];
            pSVar12[1] = pSVar12[uVar7 + 1];
            pSVar12[uVar7 + 1] = SVar3;
            SVar3 = end._M_current[-1];
            end._M_current[-1] = end._M_current[-uVar7];
            end._M_current[-uVar7] = SVar3;
            if (0x80 < (long)uVar14) {
              SVar3 = pSVar12[2];
              pSVar12[2] = pSVar12[uVar7 + 2];
              pSVar12[uVar7 + 2] = SVar3;
              SVar3 = pSVar12[3];
              pSVar12[3] = pSVar12[uVar7 + 3];
              pSVar12[uVar7 + 3] = SVar3;
              SVar3 = end._M_current[-2];
              end._M_current[-2] = end._M_current[~uVar7];
              end._M_current[~uVar7] = SVar3;
              SVar3 = end._M_current[-3];
              end._M_current[-3] = end._M_current[-2 - uVar7];
              end._M_current[-2 - uVar7] = SVar3;
            }
          }
        }
        else if (pSVar13 <= pSVar10) {
          if (begin._M_current == pSVar12) {
LAB_002cee8f:
            bVar5 = true;
            if (pSVar17 == end._M_current) goto LAB_002cef54;
            uStack_38 = CONCAT44(param_3,(undefined4)uStack_38);
            pSVar10 = pSVar12 + 2;
            lVar8 = 8;
            lVar16 = 0;
            uVar7 = 0;
            do {
              pSVar13 = (SolutionEntry *)((long)&pSVar12[1].index + lVar8);
              if (pSVar13 == end._M_current) goto LAB_002cef57;
              if (*(int *)((long)&pSVar12[1].index + lVar8) <
                  *(int *)((long)&pSVar12->index + lVar8)) {
                SVar3 = *pSVar13;
                pSVar11 = pSVar10;
                lVar20 = lVar16;
                do {
                  *pSVar11 = pSVar11[-1];
                  pSVar21 = pSVar17;
                  if (lVar20 == 0) break;
                  pSVar21 = pSVar11 + -1;
                  lVar20 = lVar20 + 8;
                  pSVar18 = pSVar11 + -2;
                  pSVar11 = pSVar21;
                } while (SVar3.index < pSVar18->index);
                *pSVar21 = SVar3;
                uVar7 = uVar7 + ((long)pSVar13 - (long)pSVar21 >> 3);
              }
              lVar8 = lVar8 + 8;
              pSVar10 = pSVar10 + 1;
              lVar16 = lVar16 + -8;
            } while (uVar7 < 9);
          }
          else {
            lVar8 = 8;
            uVar7 = 0;
            _Var9._M_current = begin._M_current;
            do {
              pSVar10 = _Var9._M_current + 1;
              if (pSVar10 == pSVar12) goto LAB_002cee8f;
              if (_Var9._M_current[1].index < (_Var9._M_current)->index) {
                SVar3 = *pSVar10;
                lVar16 = lVar8;
                do {
                  lVar20 = lVar16;
                  *(undefined8 *)((long)&(begin._M_current)->index + lVar20) =
                       *(undefined8 *)((long)&begin._M_current[-1].index + lVar20);
                  _Var9._M_current = begin._M_current;
                  if (lVar20 == 8) goto LAB_002ced2d;
                  lVar16 = lVar20 + -8;
                } while (SVar3.index < *(int *)((long)&begin._M_current[-2].index + lVar20));
                _Var9._M_current = (SolutionEntry *)((long)&begin._M_current[-1].index + lVar20);
LAB_002ced2d:
                *_Var9._M_current = SVar3;
                uVar7 = uVar7 + ((long)pSVar10 - (long)_Var9._M_current >> 3);
              }
              lVar8 = lVar8 + 8;
              _Var9._M_current = pSVar10;
            } while (uVar7 < 9);
          }
        }
        pdqsort_loop<__gnu_cxx::__normal_iterator<HighsGFkSolve::SolutionEntry*,std::vector<HighsGFkSolve::SolutionEntry,std::allocator<HighsGFkSolve::SolutionEntry>>>,std::less<HighsGFkSolve::SolutionEntry>,false>
                  (begin._M_current,pSVar12,param_3,param_4 & 1);
        bVar5 = false;
        param_4 = 0;
        begin._M_current = pSVar17;
      }
    }
LAB_002cef57:
    if (bVar5) {
      return;
    }
  } while( true );
}

Assistant:

inline void pdqsort_loop(Iter begin, Iter end, Compare comp, int bad_allowed, bool leftmost = true) {
        typedef typename std::iterator_traits<Iter>::difference_type diff_t;

        // Use a while loop for tail recursion elimination.
        while (true) {
            diff_t size = end - begin;

            // Insertion sort is faster for small arrays.
            if (size < insertion_sort_threshold) {
                if (leftmost) insertion_sort(begin, end, comp);
                else unguarded_insertion_sort(begin, end, comp);
                return;
            }

            // Choose pivot as median of 3 or pseudomedian of 9.
            diff_t s2 = size / 2;
            if (size > ninther_threshold) {
                sort3(begin, begin + s2, end - 1, comp);
                sort3(begin + 1, begin + (s2 - 1), end - 2, comp);
                sort3(begin + 2, begin + (s2 + 1), end - 3, comp);
                sort3(begin + (s2 - 1), begin + s2, begin + (s2 + 1), comp);
                std::iter_swap(begin, begin + s2);
            } else sort3(begin + s2, begin, end - 1, comp);

            // If *(begin - 1) is the end of the right partition of a previous partition operation
            // there is no element in [begin, end) that is smaller than *(begin - 1). Then if our
            // pivot compares equal to *(begin - 1) we change strategy, putting equal elements in
            // the left partition, greater elements in the right partition. We do not have to
            // recurse on the left partition, since it's sorted (all equal).
            if (!leftmost && !comp(*(begin - 1), *begin)) {
                begin = partition_left(begin, end, comp) + 1;
                continue;
            }

            // Partition and get results.
            std::pair<Iter, bool> part_result =
                Branchless ? partition_right_branchless(begin, end, comp)
                           : partition_right(begin, end, comp);
            Iter pivot_pos = part_result.first;
            bool already_partitioned = part_result.second;

            // Check for a highly unbalanced partition.
            diff_t l_size = pivot_pos - begin;
            diff_t r_size = end - (pivot_pos + 1);
            bool highly_unbalanced = l_size < size / 8 || r_size < size / 8;

            // If we got a highly unbalanced partition we shuffle elements to break many patterns.
            if (highly_unbalanced) {
                // If we had too many bad partitions, switch to heapsort to guarantee O(n log n).
                if (--bad_allowed == 0) {
                    std::make_heap(begin, end, comp);
                    std::sort_heap(begin, end, comp);
                    return;
                }

                if (l_size >= insertion_sort_threshold) {
                    std::iter_swap(begin,             begin + l_size / 4);
                    std::iter_swap(pivot_pos - 1, pivot_pos - l_size / 4);

                    if (l_size > ninther_threshold) {
                        std::iter_swap(begin + 1,         begin + (l_size / 4 + 1));
                        std::iter_swap(begin + 2,         begin + (l_size / 4 + 2));
                        std::iter_swap(pivot_pos - 2, pivot_pos - (l_size / 4 + 1));
                        std::iter_swap(pivot_pos - 3, pivot_pos - (l_size / 4 + 2));
                    }
                }
                
                if (r_size >= insertion_sort_threshold) {
                    std::iter_swap(pivot_pos + 1, pivot_pos + (1 + r_size / 4));
                    std::iter_swap(end - 1,                   end - r_size / 4);
                    
                    if (r_size > ninther_threshold) {
                        std::iter_swap(pivot_pos + 2, pivot_pos + (2 + r_size / 4));
                        std::iter_swap(pivot_pos + 3, pivot_pos + (3 + r_size / 4));
                        std::iter_swap(end - 2,             end - (1 + r_size / 4));
                        std::iter_swap(end - 3,             end - (2 + r_size / 4));
                    }
                }
            } else {
                // If we were decently balanced and we tried to sort an already partitioned
                // sequence try to use insertion sort.
                if (already_partitioned && partial_insertion_sort(begin, pivot_pos, comp)
                                        && partial_insertion_sort(pivot_pos + 1, end, comp)) return;
            }
                
            // Sort the left partition first using recursion and do tail recursion elimination for
            // the right-hand partition.
            pdqsort_loop<Iter, Compare, Branchless>(begin, pivot_pos, comp, bad_allowed, leftmost);
            begin = pivot_pos + 1;
            leftmost = false;
        }
    }